

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::Error(Parser *this,string *msg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  std::operator+(&bStack_38,"error: ",in_RDX);
  Message((Parser *)msg,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::Error(const std::string &msg) {
  Message("error: " + msg);
  return CheckedError(true);
}